

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QByteArray * __thiscall
QHash<QByteArray,_QByteArray>::operator[](QHash<QByteArray,_QByteArray> *this,QByteArray *key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QByteArray,QByteArray>::tryEmplace_impl<QByteArray_const&>
            (&local_28,(QHash<QByteArray,QByteArray> *)this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QByteArray *)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 0x18);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }